

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_pgroup_absolute_id(Integer grp,Integer pid)

{
  int iVar1;
  
  if (GA_World_Proc_Group != grp) {
    iVar1 = ARMCI_Absolute_id(&PGRP_LIST[grp].group,(int)pid);
    pid = (Integer)iVar1;
  }
  return pid;
}

Assistant:

Integer pnga_pgroup_absolute_id(Integer grp, Integer pid) 
{
#ifdef MSG_COMMS_MPI
  if(grp == GA_World_Proc_Group) /*a.k.a -1*/
    return pid;
  else
    return ARMCI_Absolute_id(&PGRP_LIST[grp].group, pid);
#else
  pnga_error("ga_pgroup_absolute_id(): Defined only when using MPI groups",0);
  return -1;
#endif
}